

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playermenu.cpp
# Opt level: O3

void __thiscall FValueTextItem::Drawer(FValueTextItem *this,bool selected)

{
  int iVar1;
  int iVar2;
  BYTE *string;
  char *string_00;
  EColorRange *pEVar3;
  
  string = (BYTE *)(this->mText).Chars;
  if (*string == '$') {
    string = (BYTE *)FStringTable::operator()(&GStrings,(char *)(string + 1));
  }
  pEVar3 = &OptionSettings.mFontColorSelection;
  if (!selected) {
    pEVar3 = &this->mFontColor;
  }
  DCanvas::DrawText((DCanvas *)screen,this->mFont,*pEVar3,
                    (this->super_FListMenuItemSelectable).super_FListMenuItem.mXpos,
                    (this->super_FListMenuItemSelectable).super_FListMenuItem.mYpos,(char *)string,
                    0x40001390,1,0);
  iVar1 = (this->super_FListMenuItemSelectable).super_FListMenuItem.mXpos;
  iVar2 = FFont::StringWidth(this->mFont,string);
  if ((this->mSelections).Count != 0) {
    string_00 = (this->mSelections).Array[this->mSelection].Chars;
    if (*string_00 == '$') {
      string_00 = FStringTable::operator()(&GStrings,string_00 + 1);
    }
    DCanvas::DrawText((DCanvas *)screen,this->mFont,this->mFontColor2,iVar1 + iVar2 + 8,
                      (this->super_FListMenuItemSelectable).super_FListMenuItem.mYpos,string_00,
                      0x40001390,1,0);
  }
  return;
}

Assistant:

void FValueTextItem::Drawer(bool selected)
{
	const char *text = mText;

	if (*text == '$') text = GStrings(text+1);
	screen->DrawText(mFont, selected? OptionSettings.mFontColorSelection : mFontColor, mXpos, mYpos, text, DTA_Clean, true, TAG_DONE);

	int x = mXpos + mFont->StringWidth(text) + 8;
	if (mSelections.Size() > 0)
	{
		const char *mOptValue = mSelections[mSelection];
		if (*mOptValue == '$') mOptValue = GStrings(mOptValue + 1);
		screen->DrawText(mFont, mFontColor2, x, mYpos, mOptValue, DTA_Clean, true, TAG_DONE);
	}
}